

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O1

ostream * dg::llvmdg::anon_unknown_6::printLLVMVal(ostream *os,Value *val)

{
  Value VVar1;
  raw_ostream *prVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  StringRef Str;
  StringRef SVar6;
  StringRef Str_00;
  raw_os_ostream ro;
  string str;
  ostringstream ostr;
  code *local_200;
  undefined4 local_1f8;
  long local_1f0;
  undefined8 uStack_1e8;
  long local_1e0;
  undefined1 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  ostringstream *local_1c0;
  long *local_1b8;
  ulong local_1b0;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if (val == (Value *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(null)",6);
    return os;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1f8 = 0;
  local_1d8 = 0;
  local_1d0 = 0;
  local_1c8 = 1;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_1e0 = 0;
  local_200 = std::filebuf::~filebuf;
  VVar1 = val[0x10];
  local_1c0 = local_198;
  if (VVar1 == (Value)0x15) {
    SVar6 = (StringRef)llvm::Value::getName();
    prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&local_200,SVar6);
    SVar6.Length = 2;
    SVar6.Data = "::";
    llvm::raw_ostream::operator<<(prVar2,SVar6);
    pcVar5 = "label ";
    sVar4 = 6;
  }
  else {
    if (VVar1 != (Value)0x0) {
      if (0x1a < (byte)VVar1) {
        if (*(long *)(val + 0x28) == 0) {
          pcVar5 = "<null>::";
          prVar2 = (raw_ostream *)&local_200;
          sVar4 = 8;
        }
        else {
          SVar6 = (StringRef)llvm::Value::getName();
          prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&local_200,SVar6);
          pcVar5 = "::";
          sVar4 = 2;
        }
        Str_00.Length = sVar4;
        Str_00.Data = pcVar5;
        llvm::raw_ostream::operator<<(prVar2,Str_00);
      }
      llvm::Value::print((raw_ostream *)val,false);
      goto LAB_0010eeb5;
    }
    pcVar5 = "FUN ";
    sVar4 = 4;
  }
  Str.Length = sVar4;
  Str.Data = pcVar5;
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&local_200,Str);
  SVar6 = (StringRef)llvm::Value::getName();
  llvm::raw_ostream::operator<<(prVar2,SVar6);
LAB_0010eeb5:
  if (local_1e0 != local_1f0) {
    llvm::raw_ostream::flush_nonempty();
  }
  std::__cxx11::stringbuf::str();
  if (0x32 < local_1b0) {
    std::__cxx11::string::resize((ulong)&local_1b8,'(');
  }
  uVar3 = std::__cxx11::string::find((char)&local_1b8,0x22);
  if (uVar3 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)&local_1b8,uVar3,(char *)0x1,0x1183d2);
      uVar3 = std::__cxx11::string::find((char)&local_1b8,0x22);
    } while (uVar3 != 0xffffffffffffffff);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1b8,local_1b0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_200);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return os;
}

Assistant:

inline std::ostream &printLLVMVal(std::ostream &os, const llvm::Value *val) {
    if (!val) {
        os << "(null)";
        return os;
    }

    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    if (llvm::isa<llvm::Function>(val)) {
        ro << "FUN " << val->getName();
    } else if (const auto *B = llvm::dyn_cast<llvm::BasicBlock>(val)) {
        ro << B->getParent()->getName() << "::";
        ro << "label " << val->getName();
    } else if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
        const auto *const B = I->getParent();
        if (B) {
            ro << B->getParent()->getName() << "::";
        } else {
            ro << "<null>::";
        }
        ro << *val;
    } else {
        ro << *val;
    }

    ro.flush();

    // break the string if it is too long
    std::string str = ostr.str();
    if (str.length() > 50) {
        str.resize(40);
    }

    // escape the "
    size_t pos = 0;
    while ((pos = str.find('"', pos)) != std::string::npos) {
        str.replace(pos, 1, "\\\"");
        // we replaced one char with two, so we must shift after the new "
        pos += 2;
    }

    os << str;

    return os;
}